

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdGetPsbtByteDataList
              (void *handle,void *psbt_handle,int kind,uint32_t index,uint32_t *list_num,
              void **data_list_handle)

{
  Psbt *this;
  void *pvVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this_00;
  CfdException *pCVar2;
  allocator local_79;
  undefined1 local_78 [32];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> data_list;
  int kind_local;
  
  kind_local = kind;
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_78,"PsbtHandle",(allocator *)&data_list);
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  if (data_list_handle == (void **)0x0) {
    local_78._0_8_ = "cfdcapi_psbt.cpp";
    local_78._8_4_ = 0x7b8;
    local_78._16_8_ = "CfdGetPsbtByteDataList";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"data_list_handle is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to parameter. data_list_handle is null.",
               (allocator *)&data_list);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_78);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (list_num != (uint32_t *)0x0) {
    this = *(Psbt **)((long)psbt_handle + 0x18);
    if (this != (Psbt *)0x0) {
      data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      data_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      switch(kind) {
      case 5:
        cfd::core::Psbt::GetTxInFinalScript
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78,
                   this,index,true);
        break;
      case 6:
        cfd::core::Psbt::GetTxInRecordKeyList
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78,
                   this,index);
        break;
      case 7:
        cfd::core::Psbt::GetTxOutRecordKeyList
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78,
                   this,index);
        break;
      case 8:
        cfd::core::Psbt::GetGlobalRecordKeyList
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78,
                   this);
        break;
      default:
        local_78._0_8_ = "cfdcapi_psbt.cpp";
        local_78._8_4_ = 0x7d9;
        local_78._16_8_ = "CfdGetPsbtByteDataList";
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)local_78,"kind is invalid: {}",&kind_local);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_78,"Failed to parameter. kind is invalid.",&local_79);
        cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_78);
        __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::_M_move_assign
                (&data_list,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_78);
      std::__cxx11::string::string((string *)local_78,"PsbtDataList",&local_79);
      pvVar1 = cfd::capi::AllocBuffer((string *)local_78,0x18);
      std::__cxx11::string::~string((string *)local_78);
      this_00 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                operator_new(0x18);
      (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> **)((long)pvVar1 + 0x10) =
           this_00;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (this_00,&data_list);
      *list_num = (uint32_t)
                  (((long)data_list.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)data_list.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      *data_list_handle = pvVar1;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&data_list);
      return 0;
    }
    local_78._0_8_ = "cfdcapi_psbt.cpp";
    local_78._8_4_ = 0x7c4;
    local_78._16_8_ = "CfdGetPsbtByteDataList";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"psbt is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_78,"Failed to handle statement. psbt is null.",
               (allocator *)&data_list);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_78);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_78._0_8_ = "cfdcapi_psbt.cpp";
  local_78._8_4_ = 0x7be;
  local_78._16_8_ = "CfdGetPsbtByteDataList";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_78,"list_num is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_78,"Failed to parameter. list_num is null.",(allocator *)&data_list);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_78);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtByteDataList(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    uint32_t* list_num, void** data_list_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiPsbtByteDataListHandle* buffer = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (data_list_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "data_list_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. data_list_handle is null.");
    }
    if (list_num == nullptr) {
      warn(CFD_LOG_SOURCE, "list_num is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. list_num is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::vector<ByteData> data_list;
    switch (kind) {
      case kCfdPsbtRecordFinalWitness:
        data_list = psbt_obj->psbt->GetTxInFinalScript(index, true);
        break;
      case kCfdPsbtRecordInputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxInRecordKeyList(index);
        break;
      case kCfdPsbtRecordOutputUnknownKeys:
        data_list = psbt_obj->psbt->GetTxOutRecordKeyList(index);
        break;
      case kCfdPsbtRecordGlobalUnknownKeys:
        data_list = psbt_obj->psbt->GetGlobalRecordKeyList();
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    buffer = static_cast<CfdCapiPsbtByteDataListHandle*>(AllocBuffer(
        kPrefixPsbtByteDataList, sizeof(CfdCapiPsbtByteDataListHandle)));
    buffer->data_list = new std::vector<ByteData>();
    *(buffer->data_list) = data_list;
    *list_num = static_cast<uint32_t>(data_list.size());
    *data_list_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreePsbtByteDataList(handle, buffer);
  return result;
}